

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.cpp
# Opt level: O3

bool MeCab::anon_unknown_20::connect<true>
               (size_t pos,Node *rnode,Node **begin_node_list,Node **end_node_list,
               Connector *connector,Allocator<mecab_node_t,_mecab_path_t> *allocator)

{
  Node **ppNVar1;
  mecab_node_t *pmVar2;
  mecab_path_t *pmVar3;
  mecab_node_t *pmVar4;
  mecab_node_t *pmVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  if (rnode != (Node *)0x0) {
    ppNVar1 = begin_node_list + pos;
    do {
      pmVar5 = *ppNVar1;
      if (pmVar5 == (mecab_node_t *)0x0) {
        return false;
      }
      pmVar4 = (mecab_node_t *)0x0;
      lVar6 = 0x7fffffff;
      do {
        lVar8 = (long)rnode->wcost +
                (long)*(short *)((long)&end_node_list[3]->prev +
                                (ulong)pmVar5->rcAttr * 2 +
                                (ulong)rnode->lcAttr * (ulong)*(ushort *)(end_node_list + 4) * 2);
        lVar7 = lVar8 + pmVar5->cost;
        pmVar2 = pmVar5;
        if (lVar6 <= lVar7) {
          lVar7 = lVar6;
          pmVar2 = pmVar4;
        }
        pmVar4 = pmVar2;
        pmVar3 = Allocator<mecab_node_t,_mecab_path_t>::newPath
                           ((Allocator<mecab_node_t,_mecab_path_t> *)connector);
        pmVar3->cost = (int)lVar8;
        pmVar3->rnode = rnode;
        pmVar3->lnode = pmVar5;
        pmVar3->lnext = rnode->lpath;
        rnode->lpath = pmVar3;
        pmVar3->rnext = pmVar5->rpath;
        pmVar5->rpath = pmVar3;
        pmVar5 = pmVar5->enext;
        lVar6 = lVar7;
      } while (pmVar5 != (mecab_node_t *)0x0);
      if (pmVar4 == (mecab_node_t *)0x0) {
        return false;
      }
      rnode->prev = pmVar4;
      rnode->next = (mecab_node_t *)0x0;
      rnode->cost = lVar7;
      rnode->enext = ppNVar1[rnode->rlength];
      ppNVar1[rnode->rlength] = rnode;
      rnode = rnode->bnext;
    } while (rnode != (mecab_node_t *)0x0);
  }
  return true;
}

Assistant:

bool connect(size_t pos, Node *rnode,
                                       Node **begin_node_list,
                                       Node **end_node_list,
                                       const Connector *connector,
                                       Allocator<Node, Path> *allocator) {
  for (;rnode; rnode = rnode->bnext) {
    register long best_cost = 2147483647;
    Node* best_node = 0;
    for (Node *lnode = end_node_list[pos]; lnode; lnode = lnode->enext) {
      register int lcost = connector->cost(lnode, rnode);  // local cost
      register long cost = lnode->cost + lcost;

      if (cost < best_cost) {
        best_node  = lnode;
        best_cost  = cost;
  }

      if (IsAllPath) {
        Path *path   = allocator->newPath();
        path->cost   = lcost;
        path->rnode  = rnode;
        path->lnode  = lnode;
        path->lnext  = rnode->lpath;
        rnode->lpath = path;
        path->rnext  = lnode->rpath;
        lnode->rpath = path;
      }
    }

    // overflow check 2003/03/09
    if (!best_node) {
      return false;
  }

    rnode->prev = best_node;
    rnode->next = 0;
    rnode->cost = best_cost;
    const size_t x = rnode->rlength + pos;
    rnode->enext = end_node_list[x];
    end_node_list[x] = rnode;
  }

  return true;
  }